

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O1

void VTuneChakraProfile::LogLoopBodyLoadEvent
               (FunctionBody *body,LoopEntryPointInfo *entryPoint,uint16 loopNumber)

{
  uint uVar1;
  char16 *string;
  size_t sVar2;
  HeapAllocator *this;
  utf8char_t *dest;
  utf8char_t *buffer;
  ulong byteSize;
  uint cchSource;
  undefined1 local_b0 [8];
  TrackAllocData data;
  iJIT_Method_Load methodInfo;
  
  if (isJitProfilingActive) {
    data.line = 0;
    data._36_4_ = 0;
    string = Js::ParseableFunctionInfo::GetExternalDisplayName(&body->super_ParseableFunctionInfo);
    sVar2 = PAL_wcslen(string);
    cchSource = (uint)sVar2;
    if (0x5555554f < cchSource) {
      Math::DefaultOverflowPolicy();
    }
    byteSize = (ulong)(cchSource * 3 + 0x12);
    local_b0 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_32bd3bf;
    data.filename._0_4_ = 0x85;
    data.plusSize = byteSize;
    this = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
    dest = (utf8char_t *)Memory::HeapAllocator::AllocT<true>(this,byteSize);
    if (dest != (utf8char_t *)0x0) {
      uVar1 = iJIT_GetNewMethodID();
      data.line = uVar1;
      sVar2 = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,byteSize,string,cchSource);
      sprintf_s((char *)(dest + sVar2),byteSize - sVar2," %s %d","Loop",(ulong)(loopNumber + 1));
      Js::EntryPointInfo::GetNativeAddress(&entryPoint->super_EntryPointInfo);
      Js::EntryPointInfo::GetCodeSize(&entryPoint->super_EntryPointInfo);
      local_b0 = (undefined1  [8])0x0;
      buffer = GetUrl(body,(size_t *)local_b0);
      iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED,&data.line);
      Output::Trace(ProfilerPhase,L"Loop body load event: %s Loop %d\n",string,
                    (ulong)(loopNumber + 1));
      if (local_b0 != (undefined1  [8])0x0) {
        Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,(size_t)local_b0);
      }
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,dest,byteSize);
    }
  }
  return;
}

Assistant:

void VTuneChakraProfile::LogLoopBodyLoadEvent(Js::FunctionBody* body, Js::LoopEntryPointInfo* entryPoint, uint16 loopNumber)
{
#if ENABLE_NATIVE_CODEGEN
    if (isJitProfilingActive)
    {
        iJIT_Method_Load methodInfo;
        memset(&methodInfo, 0, sizeof(iJIT_Method_Load));
        const char16* methodName = body->GetExternalDisplayName();
        size_t methodLength = wcslen(methodName);
        charcount_t ccMethodLength = static_cast<charcount_t>(methodLength);
        ccMethodLength = min(ccMethodLength, UINT_MAX); // Just truncate if it is too big
        constexpr size_t sizeToAdd = /* spaces */ 2 + _countof(LoopStr) + /* size of loop number */ 10 + /*NULL*/ 1;
        size_t cbUtf8MethodName = UInt32Math::MulAdd<3, sizeToAdd>(ccMethodLength);
        utf8char_t* utf8MethodName = HeapNewNoThrowArray(utf8char_t, cbUtf8MethodName);
        if(utf8MethodName)
        {
            methodInfo.method_id = iJIT_GetNewMethodID();
            size_t len = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(utf8MethodName, cbUtf8MethodName, methodName, ccMethodLength);
            sprintf_s((char*)(utf8MethodName + len), cbUtf8MethodName - len," %s %d", LoopStr, loopNumber + 1);
            methodInfo.method_name = (char*)utf8MethodName;
            methodInfo.method_load_address = (void*)entryPoint->GetNativeAddress();
            methodInfo.method_size = (uint)entryPoint->GetCodeSize();        // Size in memory - Must be exact

            size_t urlLength  = 0;
            utf8char_t* utf8Url = GetUrl(body, &urlLength);
            methodInfo.source_file_name = (char*)utf8Url;

            iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED, &methodInfo);
            OUTPUT_TRACE(Js::ProfilerPhase, _u("Loop body load event: %s Loop %d\n"), methodName, loopNumber + 1);

            if(urlLength > 0)
            {
                HeapDeleteArray(urlLength, utf8Url);
            }
            HeapDeleteArray(cbUtf8MethodName, utf8MethodName);
        }
    }
#endif
}